

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdParser.cpp
# Opt level: O2

void __thiscall CmdLineArgsParser::ParseNumberRange(CmdLineArgsParser *this,NumberRange *pRange)

{
  WCHAR WVar1;
  int i;
  int j;
  LPWSTR pWVar2;
  undefined8 *puVar3;
  char16_t *pcVar4;
  
  do {
    i = ParseInteger(this);
    WVar1 = *this->pszCurrentArg;
    if (WVar1 == L',') {
      Js::RangeBase<int>::Add(&pRange->super_RangeBase<int>,i,(RangeBase<int> *)0x0);
      pWVar2 = this->pszCurrentArg;
    }
    else {
      if (WVar1 != L'-') {
        if ((WVar1 == L'\0') || (WVar1 == L' ')) {
          Js::RangeBase<int>::Add(&pRange->super_RangeBase<int>,i,(RangeBase<int> *)0x0);
          return;
        }
        goto LAB_00346477;
      }
      this->pszCurrentArg = this->pszCurrentArg + 1;
      j = ParseInteger(this);
      if (j < i) {
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar4 = L"Range start must be less than range end";
        goto LAB_00346497;
      }
      Js::RangeBase<int>::Add(&pRange->super_RangeBase<int>,i,j,(RangeBase<int> *)0x0);
      pWVar2 = this->pszCurrentArg;
      WVar1 = *pWVar2;
      if (WVar1 != L',') {
        if ((WVar1 == L'\0') || (WVar1 == L' ')) {
          return;
        }
LAB_00346477:
        puVar3 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar4 = L"Unexpected character while parsing Range";
LAB_00346497:
        *puVar3 = pcVar4;
        __cxa_throw(puVar3,&Exception::typeinfo,0);
      }
    }
    this->pszCurrentArg = pWVar2 + 1;
  } while( true );
}

Assistant:

void
CmdLineArgsParser::ParseNumberRange(Js::NumberRange *pRange)
{
    int start = ParseInteger();
    int end;

    switch (CurChar())
    {
    case '-':
        NextChar();
        end = ParseInteger();

        if (start > end)
        {
            throw Exception(_u("Range start must be less than range end"));
        }

        pRange->Add(start, end);
        switch (CurChar())
        {
        case ',':
            NextChar();
            ParseNumberRange(pRange);
            break;

        case ' ':
        case 0:
            break;

        default:
            throw Exception(_u("Unexpected character while parsing Range"));
        }
        break;

    case ',':
        pRange->Add(start);
        NextChar();
        ParseNumberRange(pRange);
        break;

    case ' ':
    case 0:
        pRange->Add(start);
        break;

    default:
        throw Exception(_u("Unexpected character while parsing Range"));
    }

}